

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateImportedGenerationObjects
          (cmGlobalGenerator *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   *exports)

{
  cmLocalGenerator *this_00;
  bool bVar1;
  iterator iVar2;
  iterator __last;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  __last_00;
  size_type __n;
  reference ppcVar3;
  cmGeneratorTarget *local_80;
  cmGeneratorTarget *gt;
  string *t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmLocalGenerator *lg;
  iterator mfit;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *exports_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  targets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)mf;
  mf_local = (cmMakefile *)this;
  CreateGenerationObjects(this,ImportedOnly);
  iVar2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(&this->Makefiles);
  __last = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(&this->Makefiles);
  __last_00 = std::
              find<__gnu_cxx::__normal_iterator<cmMakefile**,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>,cmMakefile*>
                        (iVar2._M_current,__last._M_current,(cmMakefile **)&targets_local);
  iVar2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(&this->Makefiles);
  __n = std::
        distance<__gnu_cxx::__normal_iterator<cmMakefile**,std::vector<cmMakefile*,std::allocator<cmMakefile*>>>>
                  ((__normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                    )iVar2._M_current,__last_00);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&this->LocalGenerators,__n);
  this_00 = *ppcVar3;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(targets);
  t = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(targets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&t);
    if (!bVar1) break;
    gt = (cmGeneratorTarget *)
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    local_80 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,(string *)gt);
    if (local_80 != (cmGeneratorTarget *)0x0) {
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (exports,&local_80);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateImportedGenerationObjects(
  cmMakefile* mf, const std::vector<std::string>& targets,
  std::vector<const cmGeneratorTarget*>& exports)
{
  this->CreateGenerationObjects(ImportedOnly);
  std::vector<cmMakefile*>::iterator mfit =
    std::find(this->Makefiles.begin(), this->Makefiles.end(), mf);
  cmLocalGenerator* lg =
    this->LocalGenerators[std::distance(this->Makefiles.begin(), mfit)];
  for (std::string const& t : targets) {
    cmGeneratorTarget* gt = lg->FindGeneratorTargetToUse(t);
    if (gt) {
      exports.push_back(gt);
    }
  }
}